

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

lws_vhost * lws_create_vhost(lws_context *context,lws_context_creation_info *info)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  lws_vhost *vh_00;
  lws_log_cx *plVar4;
  void *pvVar5;
  lws_dll2_owner *plVar6;
  char *pcVar7;
  char **ppcVar8;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 uVar9;
  undefined8 in_stack_fffffffffffffe78;
  char *local_170;
  char *local_138;
  lws_role_ops *ar;
  lws_role_ops **ppxx;
  char *end;
  char *pcStack_e0;
  int n;
  char *p;
  char buf [96];
  char *local_70;
  char *name;
  int sec_pcol_count;
  int abs_pcol_count;
  int fx;
  int f;
  int m;
  lws_protocols *lwsp;
  lws_protocols *pcols;
  lws_http_mount *mounts;
  lws_vhost **vh1;
  lws_vhost *vh;
  lws_context_creation_info *info_local;
  lws_context *context_local;
  
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  mounts = (lws_http_mount *)&context->vhost_list;
  lwsp = info->protocols;
  local_70 = "default";
  if (info->vhost_name != (char *)0x0) {
    local_70 = info->vhost_name;
  }
  sVar3 = strlen(local_70);
  vh_00 = (lws_vhost *)lws_zalloc(sVar3 + 0x371,"lws_create_vhost");
  if (vh_00 != (lws_vhost *)0x0) {
    if (info->log_cx == (lws_log_cx_t *)0x0) {
      *(lws_log_cx_t **)((long)&vh_00->lc + 0x60) = &log_cx;
    }
    else {
      *(lws_log_cx_t **)((long)&vh_00->lc + 0x60) = info->log_cx;
    }
    vh_00->name = vh_00[1].proxy_basic_auth_token;
    pvVar5 = vh_00->name;
    sVar3 = strlen(local_70);
    memcpy(pvVar5,local_70,sVar3 + 1);
    if ((lwsp == (lws_protocols *)0x0) && (info->pprotocols == (lws_protocols **)0x0)) {
      lwsp = protocols_dummy;
    }
    vh_00->context = context;
    iVar1 = lws_snprintf((char *)&p,(size_t)(buf + (0x57 - (long)&p)),"%s",vh_00->name);
    pcStack_e0 = (char *)((long)&p + (long)iVar1);
    if (info->iface != (char *)0x0) {
      iVar1 = lws_snprintf(pcStack_e0,(size_t)(buf + (0x57 - (long)pcStack_e0)),"|%s",info->iface);
      pcStack_e0 = pcStack_e0 + iVar1;
    }
    if ((info->port != 0) && ((info->port & 0xffffU) == 0)) {
      lws_snprintf(pcStack_e0,(size_t)(buf + (0x57 - (long)pcStack_e0)),"|%u",
                   (ulong)(uint)info->port);
    }
    if (info->iface == (char *)0x0) {
      local_138 = "";
    }
    else {
      local_138 = info->iface;
    }
    __lws_lc_tag(context,context->lcg + 1,&vh_00->lc,"%s|%s|%d",&p,local_138,
                 CONCAT44(uVar9,info->port));
    *(char **)((long)&vh_00->http + 0x88) = info->error_document_404;
    if ((info->options & 0x400000) == 0x400000) {
      plVar4 = lwsl_vhost_get_cx(vh_00);
      _lws_log_cx(plVar4,lws_log_prepend_vhost,vh_00,8,"lws_create_vhost","set to only support RAW")
      ;
    }
    vh_00->iface = info->iface;
    vh_00->bind_iface = info->bind_iface;
    if (info->connect_timeout_secs == 0) {
      vh_00->connect_timeout_secs = 0x14;
    }
    else {
      vh_00->connect_timeout_secs = info->connect_timeout_secs;
    }
    if (info->retry_and_idle_policy == (lws_retry_bo_t *)0x0) {
      vh_00->retry_policy = &context->default_retry;
    }
    else {
      vh_00->retry_policy = info->retry_and_idle_policy;
    }
    if (lwsp == (lws_protocols *)0x0) {
      vh_00->count_protocols = 0;
      while (info->pprotocols[vh_00->count_protocols] != (lws_protocols *)0x0) {
        vh_00->count_protocols = vh_00->count_protocols + 1;
      }
    }
    else {
      vh_00->count_protocols = 0;
      while (lwsp[vh_00->count_protocols].callback != (lws_callback_function *)0x0) {
        vh_00->count_protocols = vh_00->count_protocols + 1;
      }
    }
    vh_00->options = info->options;
    vh_00->pvo = info->pvo;
    vh_00->headers = info->headers;
    vh_00->user = info->user;
    vh_00->finalize = info->finalize;
    vh_00->finalize_arg = info->finalize_arg;
    vh_00->listen_accept_role = info->listen_accept_role;
    vh_00->listen_accept_protocol = info->listen_accept_protocol;
    vh_00->unix_socket_perms = info->unix_socket_perms;
    vh_00->fo_listen_queue = info->fo_listen_queue;
    ar = (lws_role_ops *)available_roles;
    do {
      if (ar->name == (char *)0x0) {
        if (info->keepalive_timeout == 0) {
          vh_00->keepalive_timeout = 5;
        }
        else {
          vh_00->keepalive_timeout = info->keepalive_timeout;
        }
        if (info->timeout_secs_ah_idle == 0) {
          vh_00->timeout_secs_ah_idle = 10;
        }
        else {
          vh_00->timeout_secs_ah_idle = info->timeout_secs_ah_idle;
        }
        *(char **)((long)&vh_00->tls + 0x18) = info->alpn;
        *(int *)((long)&vh_00->tls + 0x68) = info->ssl_info_event_mask;
        if (info->ecdh_curve != (char *)0x0) {
          lws_strncpy((char *)((long)&vh_00->tls + 0x38),info->ecdh_curve,0x10);
        }
        end._4_4_ = 0;
        if (info->ssl_cert_filepath != (char *)0x0) {
          sVar3 = strlen(info->ssl_cert_filepath);
          end._4_4_ = (int)sVar3 + 1;
        }
        if (info->ssl_private_key_filepath != (char *)0x0) {
          sVar3 = strlen(info->ssl_private_key_filepath);
          end._4_4_ = (int)sVar3 + 1 + end._4_4_;
        }
        if (end._4_4_ != 0) {
          pvVar5 = lws_realloc((void *)0x0,(ulong)end._4_4_,"vh paths");
          *(void **)((long)&vh_00->tls + 0x28) = pvVar5;
          *(void **)((long)&vh_00->tls + 0x30) = pvVar5;
          if (info->ssl_cert_filepath != (char *)0x0) {
            sVar3 = strlen(info->ssl_cert_filepath);
            uVar2 = (int)sVar3 + 1;
            memcpy(*(lws_dll2 **)((long)&vh_00->tls + 0x28),info->ssl_cert_filepath,(ulong)uVar2);
            *(long *)((long)&vh_00->tls + 0x30) =
                 *(long *)((long)&vh_00->tls + 0x30) + (long)(int)uVar2;
          }
          if (info->ssl_private_key_filepath != (char *)0x0) {
            pvVar5 = *(lws_dll2 **)((long)&vh_00->tls + 0x30);
            pcVar7 = info->ssl_private_key_filepath;
            sVar3 = strlen(info->ssl_private_key_filepath);
            memcpy(pvVar5,pcVar7,sVar3 + 1);
          }
        }
        pvVar5 = lws_zalloc((ulong)(vh_00->count_protocols + (int)context->plugin_protocol_count + 1
                                   ) * 0x38,"vh plugin table");
        uVar9 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20);
        if (pvVar5 == (void *)0x0) {
          _lws_log(1,"OOM\n");
          __lws_lc_untag(vh_00->context,&vh_00->lc);
          lws_realloc(vh_00,0,"lws_free");
          return (lws_vhost *)0x0;
        }
        uVar2 = vh_00->count_protocols;
        if (lwsp == (lws_protocols *)0x0) {
          for (end._4_4_ = 0; uVar9 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20),
              (int)end._4_4_ < (int)uVar2; end._4_4_ = end._4_4_ + 1) {
            memcpy((void *)((long)pvVar5 + (long)(int)end._4_4_ * 0x38),
                   info->pprotocols[(int)end._4_4_],0x38);
          }
        }
        else {
          memcpy(pvVar5,lwsp,(ulong)uVar2 * 0x38);
        }
        vh_00->protocols = (lws_protocols *)pvVar5;
        vh_00->field_0x368 = vh_00->field_0x368 & 0xfe | 1;
        plVar6 = (lws_dll2_owner *)
                 lws_zalloc((ulong)(uint)vh_00->count_protocols * 0x18,"same vh list");
        vh_00->same_vh_protocol_owner = plVar6;
        *(lws_http_mount **)((long)&vh_00->http + 0x80) = info->mounts;
        if ((vh_00->options & 0x4000) == 0) {
          if (info->port == -2) {
            strcpy((char *)&p,"(no listener)");
          }
          else if (info->port == -1) {
            strcpy((char *)&p,"(serving disabled)");
          }
          else {
            lws_snprintf((char *)&p,0x60,"port %u",(ulong)(uint)info->port);
          }
          plVar4 = lwsl_vhost_get_cx(vh_00);
          _lws_log_cx(plVar4,lws_log_prepend_vhost,vh_00,8,"lws_create_vhost",
                      "Creating Vhost \'%s\' %s, %d protocols, IPv6 %s",vh_00->name,&p,
                      CONCAT44(uVar9,vh_00->count_protocols),"off");
        }
        else {
          plVar4 = lwsl_vhost_get_cx(vh_00);
          _lws_log_cx(plVar4,lws_log_prepend_vhost,vh_00,8,"lws_create_vhost",
                      "Creating \'%s\' path \"%s\", %d protocols",vh_00->name,vh_00->iface,
                      CONCAT44(uVar9,vh_00->count_protocols));
        }
        for (pcols = (lws_protocols *)info->mounts; pcols != (lws_protocols *)0x0;
            pcols = (lws_protocols *)pcols->name) {
          plVar4 = lwsl_vhost_get_cx(vh_00);
          if (pcols->per_session_data_size == 0) {
            local_170 = "none";
          }
          else {
            local_170 = (char *)pcols->per_session_data_size;
          }
          _lws_log_cx(plVar4,lws_log_prepend_vhost,vh_00,8,"lws_create_vhost",
                      "   mounting %s%s to %s",
                      mount_protocols[*(byte *)((long)&pcols[1].per_session_data_size + 5)],
                      local_170,pcols->callback);
        }
        vh_00->listen_port = info->port;
        *(uint *)((long)&vh_00->http + 0x90) = 0;
        (vh_00->http).http_proxy_address[0] = 0;
        if (info->http_proxy_address == (char *)0x0) {
          pcVar7 = getenv("http_proxy");
          if (pcVar7 != (char *)0x0) {
            lws_strncpy((char *)&p,pcVar7,0x60);
            lws_set_proxy(vh_00,(char *)&p);
          }
        }
        else {
          if (info->http_proxy_port != 0) {
            *(uint *)((long)&vh_00->http + 0x90) = info->http_proxy_port;
          }
          lws_set_proxy(vh_00,info->http_proxy_address);
        }
        vh_00->ka_time = info->ka_time;
        vh_00->ka_interval = info->ka_interval;
        vh_00->ka_probes = info->ka_probes;
        if ((vh_00->options & 0x8000) != 0) {
          plVar4 = lwsl_vhost_get_cx(vh_00);
          _lws_log_cx(plVar4,lws_log_prepend_vhost,vh_00,4,"lws_create_vhost","   STS enabled");
        }
        iVar1 = lws_context_init_server_ssl(info,vh_00);
        if (iVar1 == 0) {
          iVar1 = lws_context_init_client_ssl(info,vh_00);
          if (iVar1 == 0) {
            iVar1 = _lws_vhost_init_server(info,vh_00);
            if (iVar1 < 0) {
              plVar4 = lwsl_vhost_get_cx(vh_00);
              _lws_log_cx(plVar4,lws_log_prepend_vhost,vh_00,1,"lws_create_vhost",
                          "init server failed\n");
            }
            else {
              for (; mounts->mount_next != (lws_http_mount *)0x0;
                  mounts = (lws_http_mount *)&mounts->mount_next[5].extra_mimetypes) {
              }
              mounts->mount_next = (lws_http_mount *)vh_00;
              if ((*(ushort *)&context->field_0x7b7 >> 6 & 1) == 0) {
                return vh_00;
              }
              iVar1 = lws_protocol_init(context);
              if (iVar1 == 0) {
                return vh_00;
              }
              plVar4 = lwsl_vhost_get_cx(vh_00);
              _lws_log_cx(plVar4,lws_log_prepend_vhost,vh_00,1,"lws_create_vhost",
                          "lws_protocol_init failed");
            }
          }
          else {
            plVar4 = lwsl_vhost_get_cx(vh_00);
            _lws_log_cx(plVar4,lws_log_prepend_vhost,vh_00,1,"lws_create_vhost",
                        "lws_context_init_client_ssl failed");
          }
        }
        else {
          plVar4 = lwsl_vhost_get_cx(vh_00);
          _lws_log_cx(plVar4,lws_log_prepend_vhost,vh_00,1,"lws_create_vhost",
                      "lws_context_init_server_ssl failed");
        }
        lws_vhost_destroy(vh_00);
        return (lws_vhost *)0x0;
      }
      ppcVar8 = &ar->alpn;
      pcVar7 = ar->name;
      ar = (lws_role_ops *)ppcVar8;
    } while (((int)(uint)(byte)pcVar7[0x19] >> 4 == 0) ||
            (iVar1 = (**(code **)(*(long *)(pcVar7 + 0x10) +
                                 (long)(((int)(uint)(byte)pcVar7[0x19] >> 4) + -1) * 8))(vh_00,info)
            , iVar1 == 0));
  }
  return (lws_vhost *)0x0;
}

Assistant:

struct lws_vhost *
lws_create_vhost(struct lws_context *context,
		 const struct lws_context_creation_info *info)
{
	struct lws_vhost *vh, **vh1 = &context->vhost_list;
	const struct lws_http_mount *mounts;
	const struct lws_protocols *pcols = info->protocols;
#ifdef LWS_WITH_PLUGINS
	struct lws_plugin *plugin = context->plugin_list;
#endif
	struct lws_protocols *lwsp;
	int m, f = !info->pvo, fx = 0, abs_pcol_count = 0, sec_pcol_count = 0;
	const char *name = "default";
	char buf[96];
	char *p;
#if defined(LWS_WITH_SYS_ASYNC_DNS)
	extern struct lws_protocols lws_async_dns_protocol;
#endif
	int n;

	if (info->vhost_name)
		name = info->vhost_name;

	if (lws_fi(&info->fic, "vh_create_oom"))
		vh = NULL;
	else
		vh = lws_zalloc(sizeof(*vh) + strlen(name) + 1
#if defined(LWS_WITH_EVENT_LIBS)
			+ context->event_loop_ops->evlib_size_vh
#endif
			, __func__);
	if (!vh)
		goto early_bail;

	if (info->log_cx)
		vh->lc.log_cx = info->log_cx;
	else
		vh->lc.log_cx = &log_cx;

#if defined(LWS_WITH_EVENT_LIBS)
	vh->evlib_vh = (void *)&vh[1];
	vh->name = (const char *)vh->evlib_vh +
			context->event_loop_ops->evlib_size_vh;
#else
	vh->name = (const char *)&vh[1];
#endif
	memcpy((char *)vh->name, name, strlen(name) + 1);

#if LWS_MAX_SMP > 1
	lws_mutex_refcount_init(&vh->mr);
#endif

	if (!pcols && !info->pprotocols)
		pcols = &protocols_dummy[0];

	vh->context = context;
	{
		char *end = buf + sizeof(buf) - 1;
		p = buf;

		p += lws_snprintf(p, lws_ptr_diff_size_t(end, p), "%s", vh->name);
		if (info->iface)
			p += lws_snprintf(p, lws_ptr_diff_size_t(end, p), "|%s", info->iface);
		if (info->port && !(info->port & 0xffff))
			p += lws_snprintf(p, lws_ptr_diff_size_t(end, p), "|%u", info->port);
	}

	__lws_lc_tag(context, &context->lcg[LWSLCG_VHOST], &vh->lc, "%s|%s|%d",
		     buf, info->iface ? info->iface : "", info->port);

#if defined(LWS_WITH_SYS_FAULT_INJECTION)
	vh->fic.name = "vh";
	if (info->fic.fi_owner.count)
		/*
		 * This moves all the lws_fi_t from info->fi to the vhost fi,
		 * leaving it empty
		 */
		lws_fi_import(&vh->fic, &info->fic);

	lws_fi_inherit_copy(&vh->fic, &context->fic, "vh", vh->name);
	if (lws_fi(&vh->fic, "vh_create_oom"))
		goto bail;
#endif

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	vh->http.error_document_404 = info->error_document_404;
#endif

	if (lws_check_opt(info->options, LWS_SERVER_OPTION_ONLY_RAW))
		lwsl_vhost_info(vh, "set to only support RAW");

	vh->iface = info->iface;
#if !defined(LWS_PLAT_FREERTOS) && !defined(OPTEE_TA) && !defined(WIN32)
	vh->bind_iface = info->bind_iface;
#endif
#if defined(LWS_WITH_CLIENT)
	if (info->connect_timeout_secs)
		vh->connect_timeout_secs = (int)info->connect_timeout_secs;
	else
		vh->connect_timeout_secs = 20;
#endif
	/* apply the context default lws_retry */

	if (info->retry_and_idle_policy)
		vh->retry_policy = info->retry_and_idle_policy;
	else
		vh->retry_policy = &context->default_retry;

	/*
	 * let's figure out how many protocols the user is handing us, using the
	 * old or new way depending on what he gave us
	 */

	if (!pcols)
		for (vh->count_protocols = 0;
			info->pprotocols[vh->count_protocols];
			vh->count_protocols++)
			;
	else
		for (vh->count_protocols = 0;
			pcols[vh->count_protocols].callback;
			vh->count_protocols++)
				;

	vh->options			= info->options;
	vh->pvo				= info->pvo;
	vh->headers			= info->headers;
	vh->user			= info->user;
	vh->finalize			= info->finalize;
	vh->finalize_arg		= info->finalize_arg;
	vh->listen_accept_role		= info->listen_accept_role;
	vh->listen_accept_protocol	= info->listen_accept_protocol;
	vh->unix_socket_perms		= info->unix_socket_perms;
	vh->fo_listen_queue		= info->fo_listen_queue;

	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
	if (lws_rops_fidx(ar, LWS_ROPS_init_vhost) &&
	    (lws_rops_func_fidx(ar, LWS_ROPS_init_vhost)).init_vhost(vh, info))
		return NULL;
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;


	if (info->keepalive_timeout)
		vh->keepalive_timeout = info->keepalive_timeout;
	else
		vh->keepalive_timeout = 5;

	if (info->timeout_secs_ah_idle)
		vh->timeout_secs_ah_idle = (int)info->timeout_secs_ah_idle;
	else
		vh->timeout_secs_ah_idle = 10;

#if defined(LWS_WITH_TLS)

	vh->tls.alpn = info->alpn;
	vh->tls.ssl_info_event_mask = info->ssl_info_event_mask;

	if (info->ecdh_curve)
		lws_strncpy(vh->tls.ecdh_curve, info->ecdh_curve,
			    sizeof(vh->tls.ecdh_curve));

	/* carefully allocate and take a copy of cert + key paths if present */
	n = 0;
	if (info->ssl_cert_filepath)
		n += (int)strlen(info->ssl_cert_filepath) + 1;
	if (info->ssl_private_key_filepath)
		n += (int)strlen(info->ssl_private_key_filepath) + 1;

	if (n) {
		vh->tls.key_path = vh->tls.alloc_cert_path =
					lws_malloc((unsigned int)n, "vh paths");
		if (info->ssl_cert_filepath) {
			n = (int)strlen(info->ssl_cert_filepath) + 1;
			memcpy(vh->tls.alloc_cert_path,
			       info->ssl_cert_filepath, (unsigned int)n);
			vh->tls.key_path += n;
		}
		if (info->ssl_private_key_filepath)
			memcpy(vh->tls.key_path, info->ssl_private_key_filepath,
			       strlen(info->ssl_private_key_filepath) + 1);
	}
#endif

#if defined(LWS_WITH_HTTP_PROXY) && defined(LWS_ROLE_WS)
	fx = 1;
#endif
#if defined(LWS_WITH_ABSTRACT)
	abs_pcol_count = (int)LWS_ARRAY_SIZE(available_abstract_protocols) - 1;
#endif
#if defined(LWS_WITH_SECURE_STREAMS)
	sec_pcol_count = (int)LWS_ARRAY_SIZE(available_secstream_protocols) - 1;
#endif

	/*
	 * give the vhost a unified list of protocols including:
	 *
	 * - internal, async_dns if enabled (first vhost only)
	 * - internal, abstracted ones
	 * - the ones that came from plugins
	 * - his user protocols
	 */

	if (lws_fi(&vh->fic, "vh_create_pcols_oom"))
		lwsp = NULL;
	else
		lwsp = lws_zalloc(sizeof(struct lws_protocols) *
				((unsigned int)vh->count_protocols +
				   (unsigned int)abs_pcol_count +
				   (unsigned int)sec_pcol_count +
				   (unsigned int)context->plugin_protocol_count +
				   (unsigned int)fx + 1), "vh plugin table");
	if (!lwsp) {
		lwsl_err("OOM\n");
		goto bail;
	}

	/*
	 * 1: user protocols (from pprotocols or protocols)
	 */

	m = vh->count_protocols;
	if (!pcols) {
		for (n = 0; n < m; n++)
			memcpy(&lwsp[n], info->pprotocols[n], sizeof(lwsp[0]));
	} else
		memcpy(lwsp, pcols, sizeof(struct lws_protocols) * (unsigned int)m);

	/*
	 * 2: abstract protocols
	 */
#if defined(LWS_WITH_ABSTRACT)
	for (n = 0; n < abs_pcol_count; n++) {
		memcpy(&lwsp[m++], available_abstract_protocols[n],
		       sizeof(*lwsp));
		vh->count_protocols++;
	}
#endif
	/*
	 * 3: async dns protocol (first vhost only)
	 */
#if defined(LWS_WITH_SYS_ASYNC_DNS)
	if (!context->vhost_list) {
		memcpy(&lwsp[m++], &lws_async_dns_protocol,
		       sizeof(struct lws_protocols));
		vh->count_protocols++;
	}
#endif

#if defined(LWS_WITH_SECURE_STREAMS)
	for (n = 0; n < sec_pcol_count; n++) {
		memcpy(&lwsp[m++], available_secstream_protocols[n],
		       sizeof(*lwsp));
		vh->count_protocols++;
	}
#endif

	/*
	 * 3: For compatibility, all protocols enabled on vhost if only
	 * the default vhost exists.  Otherwise only vhosts who ask
	 * for a protocol get it enabled.
	 */

	if (context->options & LWS_SERVER_OPTION_EXPLICIT_VHOSTS)
		f = 0;
	(void)f;
#ifdef LWS_WITH_PLUGINS
	if (plugin) {
		while (plugin) {
			const lws_plugin_protocol_t *plpr =
				(const lws_plugin_protocol_t *)plugin->hdr;

			for (n = 0; n < plpr->count_protocols; n++) {
				/*
				 * for compatibility's sake, no pvo implies
				 * allow all protocols
				 */
				if (f || lws_vhost_protocol_options(vh,
						plpr->protocols[n].name)) {
					memcpy(&lwsp[m],
					       &plpr->protocols[n],
					       sizeof(struct lws_protocols));
					m++;
					vh->count_protocols++;
				}
			}
			plugin = plugin->list;
		}
	}
#endif

#if defined(LWS_WITH_HTTP_PROXY) && defined(LWS_ROLE_WS)
	memcpy(&lwsp[m++], &lws_ws_proxy, sizeof(*lwsp));
	vh->count_protocols++;
#endif

	vh->protocols = lwsp;
	vh->allocated_vhost_protocols = 1;

	vh->same_vh_protocol_owner = (struct lws_dll2_owner *)
			lws_zalloc(sizeof(struct lws_dll2_owner) *
				   (unsigned int)vh->count_protocols, "same vh list");
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	vh->http.mount_list = info->mounts;
#endif

#if defined(LWS_WITH_SYS_METRICS) && defined(LWS_WITH_SERVER)
	{
		char *end = buf + sizeof(buf) - 1;
		p = buf;

		p += lws_snprintf(p, lws_ptr_diff_size_t(end, p), "vh.%s", vh->name);
		if (info->iface)
			p += lws_snprintf(p, lws_ptr_diff_size_t(end, p), ".%s", info->iface);
		if (info->port && !(info->port & 0xffff))
			p += lws_snprintf(p, lws_ptr_diff_size_t(end, p), ".%u", info->port);
		p += lws_snprintf(p, lws_ptr_diff_size_t(end, p), ".rx");
		vh->mt_traffic_rx = lws_metric_create(context, 0, buf);
		p[-2] = 't';
		vh->mt_traffic_tx = lws_metric_create(context, 0, buf);
	}
#endif

#ifdef LWS_WITH_UNIX_SOCK
	if (LWS_UNIX_SOCK_ENABLED(vh)) {
		lwsl_vhost_info(vh, "Creating '%s' path \"%s\", %d protocols",
				vh->name, vh->iface, vh->count_protocols);
	} else
#endif
	{
		switch(info->port) {
		case CONTEXT_PORT_NO_LISTEN:
			strcpy(buf, "(serving disabled)");
			break;
		case CONTEXT_PORT_NO_LISTEN_SERVER:
			strcpy(buf, "(no listener)");
			break;
		default:
			lws_snprintf(buf, sizeof(buf), "port %u", info->port);
			break;
		}
		lwsl_vhost_info(vh, "Creating Vhost '%s' %s, %d protocols, IPv6 %s",
			    vh->name, buf, vh->count_protocols,
			    LWS_IPV6_ENABLED(vh) ? "on" : "off");
	}
	mounts = info->mounts;
	while (mounts) {
		(void)mount_protocols[0];
		lwsl_vhost_info(vh, "   mounting %s%s to %s",
			  mount_protocols[mounts->origin_protocol],
			  mounts->origin ? mounts->origin : "none",
			  mounts->mountpoint);

		mounts = mounts->mount_next;
	}

	vh->listen_port = info->port;

#if defined(LWS_WITH_SOCKS5)
	vh->socks_proxy_port = 0;
	vh->socks_proxy_address[0] = '\0';
#endif

#if defined(LWS_WITH_CLIENT) && defined(LWS_CLIENT_HTTP_PROXYING)
	/* either use proxy from info, or try get it from env var */
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	vh->http.http_proxy_port = 0;
	vh->http.http_proxy_address[0] = '\0';
	/* http proxy */
	if (info->http_proxy_address) {
		/* override for backwards compatibility */
		if (info->http_proxy_port)
			vh->http.http_proxy_port = info->http_proxy_port;
		lws_set_proxy(vh, info->http_proxy_address);
	} else
#endif
	{
#ifdef LWS_HAVE_GETENV
#if defined(__COVERITY__)
		p = NULL;
#else
		p = getenv("http_proxy"); /* coverity[tainted_scalar] */
		if (p) {
			lws_strncpy(buf, p, sizeof(buf));
			lws_set_proxy(vh, buf);
		}
#endif
#endif
	}
#endif
#if defined(LWS_WITH_SOCKS5)
	lws_socks5c_ads_server(vh, info);
#endif

	vh->ka_time = info->ka_time;
	vh->ka_interval = info->ka_interval;
	vh->ka_probes = info->ka_probes;

	if (vh->options & LWS_SERVER_OPTION_STS)
		lwsl_vhost_notice(vh, "   STS enabled");

#ifdef LWS_WITH_ACCESS_LOG
	if (info->log_filepath) {
		if (lws_fi(&vh->fic, "vh_create_access_log_open_fail"))
			vh->log_fd = (int)LWS_INVALID_FILE;
		else
			vh->log_fd = lws_open(info->log_filepath,
				  O_CREAT | O_APPEND | O_RDWR, 0600);
		if (vh->log_fd == (int)LWS_INVALID_FILE) {
			lwsl_vhost_err(vh, "unable to open log filepath %s",
					   info->log_filepath);
			goto bail;
		}
#ifndef WIN32
		if (context->uid != (uid_t)-1)
			if (chown(info->log_filepath, context->uid,
				  context->gid) == -1)
				lwsl_vhost_err(vh, "unable to chown log file %s",
						   info->log_filepath);
#endif
	} else
		vh->log_fd = (int)LWS_INVALID_FILE;
#endif
	if (lws_fi(&vh->fic, "vh_create_ssl_srv") ||
	    lws_context_init_server_ssl(info, vh)) {
		lwsl_vhost_err(vh, "lws_context_init_server_ssl failed");
		goto bail1;
	}
	if (lws_fi(&vh->fic, "vh_create_ssl_cli") ||
	    lws_context_init_client_ssl(info, vh)) {
		lwsl_vhost_err(vh, "lws_context_init_client_ssl failed");
		goto bail1;
	}
#if defined(LWS_WITH_SERVER)
	lws_context_lock(context, __func__);
	if (lws_fi(&vh->fic, "vh_create_srv_init"))
		n = -1;
	else
		n = _lws_vhost_init_server(info, vh);
	lws_context_unlock(context);
	if (n < 0) {
		lwsl_vhost_err(vh, "init server failed\n");
		goto bail1;
	}
#endif

#if defined(LWS_WITH_SYS_ASYNC_DNS)
	n = !!context->vhost_list;
#endif

	while (1) {
		if (!(*vh1)) {
			*vh1 = vh;
			break;
		}
		vh1 = &(*vh1)->vhost_next;
	};

#if defined(LWS_WITH_SYS_ASYNC_DNS)
	if (!n)
		lws_async_dns_init(context);
#endif

	/* for the case we are adding a vhost much later, after server init */

	if (context->protocol_init_done)
		if (lws_fi(&vh->fic, "vh_create_protocol_init") ||
		    lws_protocol_init(context)) {
			lwsl_vhost_err(vh, "lws_protocol_init failed");
			goto bail1;
		}

	return vh;

bail1:
	lws_vhost_destroy(vh);

	return NULL;

bail:
	__lws_lc_untag(vh->context, &vh->lc);
	lws_fi_destroy(&vh->fic);
	lws_free(vh);

early_bail:
	lws_fi_destroy(&info->fic);

	return NULL;
}